

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_conversion.cpp
# Opt level: O1

void duckdb::ArrowToDuckDBList
               (Vector *vector,ArrowArray *array,ArrowArrayScanState *array_state,idx_t size,
               ArrowType *arrow_type,int64_t nested_offset,ValidityMask *parent_mask,
               int64_t parent_offset)

{
  ValidityMask *mask;
  uint *puVar1;
  ArrowScanLocalState *scan_state;
  void *pvVar2;
  void *pvVar3;
  ulong uVar4;
  unsigned_long *puVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  ArrowArray *array_00;
  byte bVar6;
  element_type *peVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  ArrowVariableSizeType AVar9;
  bool bVar10;
  pointer pAVar11;
  ArrowListInfo *this_00;
  ulong *puVar12;
  Vector *vector_00;
  TemplatedValidityData<unsigned_long> *pTVar13;
  ArrowArrayScanState *array_state_00;
  ArrowType *this_01;
  long *plVar14;
  ulong *puVar15;
  uint uVar16;
  uint uVar17;
  char cVar18;
  idx_t i;
  ulong uVar19;
  ulong *puVar20;
  idx_t iVar21;
  idx_t iVar22;
  long lVar23;
  ulong uVar24;
  uint64_t in_stack_ffffffffffffff60;
  element_type *local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_60;
  ArrowArray *local_58;
  int64_t local_50;
  ArrowListInfo *local_48;
  ArrowArrayScanState *local_40;
  idx_t local_38;
  
  scan_state = array_state->state;
  local_40 = array_state;
  pAVar11 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&arrow_type->type_info);
  local_48 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar11);
  FlatVector::VerifyFlatVector(vector);
  mask = &vector->validity;
  GetValidityMask(mask,array,scan_state,size,parent_offset,nested_offset,false);
  if (nested_offset == -1) {
    lVar23 = array->offset + parent_offset + scan_state->chunk_offset;
  }
  else {
    lVar23 = array->offset + nested_offset;
  }
  pAVar11 = unique_ptr<duckdb::ArrowTypeInfo,_std::default_delete<duckdb::ArrowTypeInfo>,_true>::
            operator->(&arrow_type->type_info);
  this_00 = ArrowTypeInfo::Cast<duckdb::ArrowListInfo>(pAVar11);
  AVar9 = ArrowListInfo::GetSizeType(this_00);
  bVar10 = ArrowListInfo::IsView(this_00);
  if (bVar10) {
    pvVar2 = array->buffers[1];
    pvVar3 = array->buffers[2];
    if (AVar9 == NORMAL) {
      puVar1 = (uint *)((long)pvVar2 + lVar23 * 4);
      if (size == 0) {
        uVar16 = 0;
      }
      else {
        uVar16 = *puVar1;
      }
      puVar15 = (ulong *)vector->data;
      if (size == 0) {
        iVar22 = 0;
      }
      else {
        puVar12 = puVar15 + 1;
        iVar21 = 0;
        iVar22 = 0;
        uVar17 = uVar16;
        do {
          uVar16 = puVar1[iVar21];
          puVar12[-1] = (ulong)uVar16;
          uVar24 = (ulong)*(uint *)((long)pvVar3 + iVar21 * 4 + lVar23 * 4);
          iVar22 = iVar22 + uVar24;
          if (uVar17 < uVar16) {
            uVar16 = uVar17;
          }
          *puVar12 = uVar24;
          if (uVar24 == 0) {
            uVar16 = uVar17;
          }
          iVar21 = iVar21 + 1;
          puVar12 = puVar12 + 2;
          uVar17 = uVar16;
        } while (size != iVar21);
      }
      uVar24 = (ulong)uVar16;
      if ((size != 0) && (uVar16 != 0)) {
        iVar21 = size;
        do {
          uVar19 = *puVar15 - uVar24;
          if (*puVar15 < uVar24) {
            uVar19 = 0;
          }
          *puVar15 = uVar19;
          puVar15 = puVar15 + 2;
          iVar21 = iVar21 - 1;
        } while (iVar21 != 0);
      }
    }
    else {
      puVar15 = (ulong *)((long)pvVar2 + lVar23 * 8);
      if (size == 0) {
        uVar24 = 0;
      }
      else {
        uVar24 = *puVar15;
      }
      puVar12 = (ulong *)vector->data;
      if (size == 0) {
        iVar22 = 0;
      }
      else {
        puVar20 = puVar12 + 1;
        iVar21 = 0;
        iVar22 = 0;
        do {
          puVar20[-1] = puVar15[iVar21];
          uVar19 = *(ulong *)((long)pvVar3 + iVar21 * 8 + lVar23 * 8);
          *puVar20 = uVar19;
          if ((*(long *)((long)pvVar3 + iVar21 * 8 + lVar23 * 8) != 0) &&
             (puVar15[iVar21] <= uVar24)) {
            uVar24 = puVar15[iVar21];
          }
          iVar22 = iVar22 + uVar19;
          iVar21 = iVar21 + 1;
          puVar20 = puVar20 + 2;
        } while (size != iVar21);
      }
      if ((size != 0) && (uVar24 != 0)) {
        iVar21 = size;
        do {
          uVar19 = *puVar12 - uVar24;
          if (*puVar12 < uVar24) {
            uVar19 = 0;
          }
          *puVar12 = uVar19;
          puVar12 = puVar12 + 2;
          iVar21 = iVar21 - 1;
        } while (iVar21 != 0);
      }
    }
    goto LAB_0156bcbc;
  }
  if (AVar9 == NORMAL) {
    if (size == 0) goto LAB_0156bbb3;
    puVar1 = (uint *)((long)array->buffers[1] + lVar23 * 4);
    uVar24 = (ulong)*puVar1;
    puVar15 = (ulong *)(vector->data + 8);
    iVar22 = 0;
    uVar19 = 0;
    do {
      puVar15[-1] = uVar19;
      uVar16 = puVar1[iVar22 + 1];
      uVar17 = puVar1[iVar22];
      iVar22 = iVar22 + 1;
      *puVar15 = (ulong)(uVar16 - uVar17);
      uVar19 = uVar19 + (uVar16 - uVar17);
      puVar15 = puVar15 + 2;
    } while (size != iVar22);
    uVar19 = (ulong)puVar1[size];
  }
  else {
    if (size == 0) {
LAB_0156bbb3:
      iVar22 = 0;
      uVar24 = 0;
      goto LAB_0156bcbc;
    }
    puVar15 = (ulong *)((long)array->buffers[1] + lVar23 * 8);
    uVar24 = *puVar15;
    plVar14 = (long *)(vector->data + 8);
    iVar22 = 0;
    lVar23 = 0;
    do {
      plVar14[-1] = lVar23;
      uVar19 = puVar15[iVar22 + 1];
      uVar4 = puVar15[iVar22];
      iVar22 = iVar22 + 1;
      *plVar14 = uVar19 - uVar4;
      lVar23 = lVar23 + (uVar19 - uVar4);
      plVar14 = plVar14 + 2;
    } while (size != iVar22);
    uVar19 = puVar15[size];
  }
  iVar22 = uVar19 - uVar24;
LAB_0156bcbc:
  ListVector::Reserve(vector,iVar22);
  ListVector::SetListSize(vector,iVar22);
  vector_00 = ListVector::GetEntry(vector);
  local_50 = array->offset;
  local_58 = *array->children;
  lVar23 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar24);
  FlatVector::VerifyFlatVector(vector_00);
  GetValidityMask(&vector_00->validity,local_58,scan_state,iVar22,local_50,lVar23,false);
  FlatVector::VerifyFlatVector(vector);
  if ((parent_mask != (ValidityMask *)0x0) &&
     (size != 0 &&
      (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask !=
      (unsigned_long *)0x0)) {
    uVar19 = 0;
    do {
      puVar5 = (parent_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((puVar5[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0)) {
        if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0
           ) {
          local_38 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)&local_68,&local_38);
          p_Var8 = p_Stack_60;
          peVar7 = local_68;
          local_68 = (element_type *)0x0;
          p_Stack_60 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          this = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
          (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = peVar7;
          (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi = p_Var8;
          if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
          }
          if (p_Stack_60 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_60);
          }
          pTVar13 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              (&(vector->validity).super_TemplatedValidityMask<unsigned_long>.
                                validity_data);
          (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask =
               (unsigned_long *)
               (pTVar13->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
        }
        bVar6 = (byte)uVar19 & 0x3f;
        puVar15 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask + (uVar19 >> 6);
        *puVar15 = *puVar15 & (-2L << bVar6 | 0xfffffffffffffffeU >> 0x40 - bVar6);
      }
      uVar19 = uVar19 + 1;
    } while (size != uVar19);
  }
  array_state_00 = ArrowArrayScanState::GetChild(local_40,0);
  array_00 = *array->children;
  this_01 = ArrowListInfo::GetChild(local_48);
  if (iVar22 == 0 && uVar24 == 0) {
    iVar22 = 0;
    lVar23 = -1;
  }
  else {
    bVar10 = ArrowType::HasDictionary(this_01);
    if (bVar10) {
      cVar18 = '\0';
    }
    else {
      bVar10 = ArrowType::RunEndEncoded(this_01);
      cVar18 = '\x02' - bVar10;
    }
    lVar23 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar24);
    if (cVar18 != '\x02') {
      if (cVar18 == '\x01') {
        ColumnArrowToDuckDBRunEndEncoded
                  (vector_00,array_00,array_state_00,iVar22,this_01,lVar23,(ValidityMask *)0x0,
                   in_stack_ffffffffffffff60);
        return;
      }
      ColumnArrowToDuckDBDictionary
                (vector_00,array_00,array_state_00,iVar22,this_01,lVar23,(ValidityMask *)0x0,0);
      return;
    }
  }
  ColumnArrowToDuckDB(vector_00,array_00,array_state_00,iVar22,this_01,lVar23,(ValidityMask *)0x0,0,
                      false);
  return;
}

Assistant:

static void ArrowToDuckDBList(Vector &vector, ArrowArray &array, ArrowArrayScanState &array_state, idx_t size,
                              const ArrowType &arrow_type, int64_t nested_offset, const ValidityMask *parent_mask,
                              int64_t parent_offset) {
	auto &scan_state = array_state.state;

	auto &list_info = arrow_type.GetTypeInfo<ArrowListInfo>();
	SetValidityMask(vector, array, scan_state, size, parent_offset, nested_offset);

	auto effective_offset = GetEffectiveOffset(array, parent_offset, scan_state, nested_offset);
	auto list_data = ConvertArrowListOffsets(vector, array, size, arrow_type, effective_offset);
	auto &start_offset = list_data.start_offset;
	auto &list_size = list_data.list_size;

	ListVector::Reserve(vector, list_size);
	ListVector::SetListSize(vector, list_size);
	auto &child_vector = ListVector::GetEntry(vector);
	SetValidityMask(child_vector, *array.children[0], scan_state, list_size, array.offset,
	                NumericCast<int64_t>(start_offset));
	auto &list_mask = FlatVector::Validity(vector);
	if (parent_mask) {
		//! Since this List is owned by a struct we must guarantee their validity map matches on Null
		if (!parent_mask->AllValid()) {
			for (idx_t i = 0; i < size; i++) {
				if (!parent_mask->RowIsValid(i)) {
					list_mask.SetInvalid(i);
				}
			}
		}
	}
	auto &child_state = array_state.GetChild(0);
	auto &child_array = *array.children[0];
	auto &child_type = list_info.GetChild();

	if (list_size == 0 && start_offset == 0) {
		D_ASSERT(!child_array.dictionary);
		ColumnArrowToDuckDB(child_vector, child_array, child_state, list_size, child_type, -1);
		return;
	}

	auto array_physical_type = GetArrowArrayPhysicalType(child_type);
	switch (array_physical_type) {
	case ArrowArrayPhysicalType::DICTIONARY_ENCODED:
		// TODO: add support for offsets
		ColumnArrowToDuckDBDictionary(child_vector, child_array, child_state, list_size, child_type,
		                              NumericCast<int64_t>(start_offset));
		break;
	case ArrowArrayPhysicalType::RUN_END_ENCODED:
		ColumnArrowToDuckDBRunEndEncoded(child_vector, child_array, child_state, list_size, child_type,
		                                 NumericCast<int64_t>(start_offset));
		break;
	case ArrowArrayPhysicalType::DEFAULT:
		ColumnArrowToDuckDB(child_vector, child_array, child_state, list_size, child_type,
		                    NumericCast<int64_t>(start_offset));
		break;
	default:
		throw NotImplementedException("ArrowArrayPhysicalType not recognized");
	}
}